

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

string * __thiscall
MidiInAlsa::getPortName_abi_cxx11_(string *__return_storage_ptr__,MidiInAlsa *this,uint portNumber)

{
  undefined8 *puVar1;
  snd_seq_t *seq;
  undefined8 uVar2;
  snd_seq_port_info_t *__s;
  void *__s_00;
  MidiApi *this_00;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  void *pvVar6;
  size_t sVar7;
  snd_seq_port_info_t *pinfo_00;
  char *pcVar8;
  string *psVar9;
  undefined8 uStack_260;
  int local_258;
  int local_254;
  char *local_250;
  char *local_248;
  undefined4 local_240;
  uint local_23c;
  snd_seq_port_info_t *local_238;
  void *local_230;
  string *local_228;
  string *local_220;
  MidiApi *local_218;
  string local_210;
  undefined4 local_1ec;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream os;
  int cnum;
  AlsaMidiData *data;
  snd_seq_port_info_t *pinfo;
  snd_seq_client_info_t *cinfo;
  uint portNumber_local;
  MidiInAlsa *this_local;
  string *stringName;
  
  uStack_260 = 0x1115c7;
  local_228 = __return_storage_ptr__;
  local_220 = __return_storage_ptr__;
  local_218 = (MidiApi *)this;
  lVar5 = snd_seq_client_info_sizeof();
  lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  pvVar6 = (void *)((long)&local_258 + lVar5);
  local_230 = pvVar6;
  *(undefined8 *)((long)&uStack_260 + lVar5) = 0x1115ef;
  sVar7 = snd_seq_client_info_sizeof();
  __s_00 = local_230;
  *(undefined8 *)((long)&uStack_260 + lVar5) = 0x111600;
  memset(__s_00,0,sVar7);
  *(undefined8 *)((long)&uStack_260 + lVar5) = 0x111607;
  lVar5 = snd_seq_port_info_sizeof();
  pinfo_00 = (snd_seq_port_info_t *)((long)pvVar6 - (lVar5 + 0xfU & 0xfffffffffffffff0));
  local_238 = pinfo_00;
  *(undefined8 *)(pinfo_00 + -8) = 0x11162f;
  sVar7 = snd_seq_port_info_sizeof();
  __s = local_238;
  *(undefined8 *)(pinfo_00 + -8) = 0x111640;
  memset(__s,0,sVar7);
  psVar9 = local_228;
  *(undefined8 *)(pinfo_00 + -8) = 0x111650;
  std::__cxx11::string::string((string *)psVar9);
  puVar1 = (undefined8 *)local_218->apiData_;
  seq = (snd_seq_t *)*puVar1;
  *(undefined8 *)(pinfo_00 + -8) = 0x111677;
  local_23c = portInfo(seq,pinfo_00,0x21,portNumber);
  if (local_23c == 0) {
    psVar9 = &local_218->errorString_;
    *(undefined8 *)(pinfo_00 + -8) = 0x11183a;
    std::__cxx11::string::operator=
              ((string *)psVar9,"MidiInAlsa::getPortName: error looking for port name!");
    psVar9 = &local_218->errorString_;
    *(undefined8 *)(pinfo_00 + -8) = 0x111853;
    std::__cxx11::string::string((string *)&local_210,(string *)psVar9);
    this_00 = local_218;
    *(undefined8 *)(pinfo_00 + -8) = 0x11186a;
    MidiApi::error(this_00,WARNING,&local_210);
    *(undefined8 *)(pinfo_00 + -8) = 0x111878;
    std::__cxx11::string::~string((string *)&local_210);
  }
  else {
    *(undefined8 *)(pinfo_00 + -8) = 0x111697;
    uVar3 = snd_seq_port_info_get_client(pinfo_00);
    uVar2 = *puVar1;
    local_240 = uVar3;
    *(undefined8 *)(pinfo_00 + -8) = 0x1116bb;
    snd_seq_get_any_client_info(uVar2,uVar3,pvVar6);
    *(undefined8 *)(pinfo_00 + -8) = 0x1116c9;
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    *(undefined8 *)(pinfo_00 + -8) = 0x1116d4;
    pcVar8 = (char *)snd_seq_client_info_get_name(pvVar6);
    local_248 = pcVar8;
    *(undefined8 *)(pinfo_00 + -8) = 0x1116f0;
    std::operator<<((ostream *)local_1c8,pcVar8);
    *(undefined8 *)(pinfo_00 + -8) = 0x111705;
    std::operator<<((ostream *)local_1c8,":");
    *(undefined8 *)(pinfo_00 + -8) = 0x111710;
    pcVar8 = (char *)snd_seq_port_info_get_name(pinfo_00);
    local_250 = pcVar8;
    *(undefined8 *)(pinfo_00 + -8) = 0x11172c;
    std::operator<<((ostream *)local_1c8,pcVar8);
    *(undefined8 *)(pinfo_00 + -8) = 0x111741;
    std::operator<<((ostream *)local_1c8," ");
    *(undefined8 *)(pinfo_00 + -8) = 0x11174c;
    iVar4 = snd_seq_port_info_get_client(pinfo_00);
    local_254 = iVar4;
    *(undefined8 *)(pinfo_00 + -8) = 0x111766;
    std::ostream::operator<<((ostream *)local_1c8,iVar4);
    *(undefined8 *)(pinfo_00 + -8) = 0x11177b;
    std::operator<<((ostream *)local_1c8,":");
    *(undefined8 *)(pinfo_00 + -8) = 0x111786;
    iVar4 = snd_seq_port_info_get_port(pinfo_00);
    local_258 = iVar4;
    *(undefined8 *)(pinfo_00 + -8) = 0x1117a0;
    std::ostream::operator<<((ostream *)local_1c8,iVar4);
    *(undefined8 *)(pinfo_00 + -8) = 0x1117b5;
    std::__cxx11::ostringstream::str();
    psVar9 = local_228;
    *(undefined8 *)(pinfo_00 + -8) = 0x1117ca;
    std::__cxx11::string::operator=((string *)psVar9,local_1e8);
    *(undefined8 *)(pinfo_00 + -8) = 0x1117d6;
    std::__cxx11::string::~string(local_1e8);
    local_1ec = 1;
    *(undefined8 *)(pinfo_00 + -8) = 0x1117f0;
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  return local_220;
}

Assistant:

std::string MidiInAlsa :: getPortName( unsigned int portNumber )
{
  snd_seq_client_info_t *cinfo;
  snd_seq_port_info_t *pinfo;
  snd_seq_client_info_alloca( &cinfo );
  snd_seq_port_info_alloca( &pinfo );

  std::string stringName;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) ) {
    int cnum = snd_seq_port_info_get_client( pinfo );
    snd_seq_get_any_client_info( data->seq, cnum, cinfo );
    std::ostringstream os;
    os << snd_seq_client_info_get_name( cinfo );
    os << ":";
    os << snd_seq_port_info_get_name( pinfo );
    os << " ";                                    // These lines added to make sure devices are listed
    os << snd_seq_port_info_get_client( pinfo );  // with full portnames added to ensure individual device names
    os << ":";
    os << snd_seq_port_info_get_port( pinfo );
    stringName = os.str();
    return stringName;
  }

  // If we get here, we didn't find a match.
  errorString_ = "MidiInAlsa::getPortName: error looking for port name!";
  error( RtMidiError::WARNING, errorString_ );
  return stringName;
}